

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bench.cc
# Opt level: O2

Timer _fill_random2<phmap::parallel_flat_hash_map<long,long,phmap::Hash<long>,phmap::EqualTo<long>,std::allocator<std::pair<long_const,long>>,4ul,phmap::NullMutex>>
                (int64_t cnt,
                parallel_flat_hash_map<long,_long,_phmap::Hash<long>,_phmap::EqualTo<long>,_std::allocator<std::pair<const_long,_long>_>,_4UL,_phmap::NullMutex>
                *hash)

{
  FILE *__stream;
  long lVar1;
  size_t sVar2;
  uint64_t uVar3;
  undefined1 auVar4 [16];
  time_point local_30;
  RSU rsu;
  
  RSU::RSU(&rsu,0x12b8f,0x12b90);
  local_30.__d.__r = (duration)std::chrono::_V2::system_clock::now();
  inner_cnt = cnt / 10;
  for (lVar1 = 0; lVar1 != 0x80; lVar1 = lVar1 + 8) {
    *(undefined8 *)((long)s_num_keys + lVar1) = 0;
  }
  for (loop_idx = 0; __stream = _stderr, loop_idx < 10; loop_idx = loop_idx + 1) {
    _fill_random_inner_mt<phmap::parallel_flat_hash_map<long,long,phmap::Hash<long>,phmap::EqualTo<long>,std::allocator<std::pair<long_const,long>>,4ul,phmap::NullMutex>>
              (inner_cnt,hash,&rsu);
    sVar2 = total_num_keys();
    out("random",sVar2,(Timer *)&local_30,false);
  }
  sVar2 = phmap::priv::
          parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashMapPolicy<long,_long>,_phmap::Hash<long>,_phmap::EqualTo<long>,_std::allocator<std::pair<const_long,_long>_>_>
          ::size((parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashMapPolicy<long,_long>,_phmap::Hash<long>,_phmap::EqualTo<long>,_std::allocator<std::pair<const_long,_long>_>_>
                  *)hash);
  auVar4._8_4_ = (int)(sVar2 >> 0x20);
  auVar4._0_8_ = sVar2;
  auVar4._12_4_ = 0x45300000;
  fprintf(__stream,"inserted %.2lfM\n",
          ((auVar4._8_8_ - 1.9342813113834067e+25) +
          ((double)CONCAT44(0x43300000,(int)sVar2) - 4503599627370496.0)) / 1000000.0);
  sVar2 = total_num_keys();
  uVar3 = spp::GetProcessMemoryUsed();
  if (outmem::max_mem < uVar3) {
    outmem::max_mem = uVar3;
  }
  if (outmem::max_keys < sVar2) {
    outmem::max_keys = sVar2;
  }
  return (Timer)local_30.__d.__r;
}

Assistant:

Timer _fill_random2(int64_t cnt, HT &hash)
{
    test = "random";
    unsigned int seed = 76687;
	RSU rsu(seed, seed + 1);

    Timer timer(true);
    const int64_t num_loops = 10;
    inner_cnt = cnt / num_loops;

    for (int i=0; i<16; ++i)
        s_num_keys[i] = 0;

    for (loop_idx=0; loop_idx<num_loops; ++loop_idx)
    {
#if 1 && MT_SUPPORT
        // multithreaded insert
        _fill_random_inner_mt(inner_cnt, hash, rsu);
#else
        _fill_random_inner(inner_cnt, hash, rsu);
#endif
        out(test, total_num_keys(), timer);
    }
    fprintf(stderr, "inserted %.2lfM\n", (double)hash.size() / 1000000);
    outmem(test, total_num_keys(), spp::GetProcessMemoryUsed());
    return timer;
}